

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

int Curl_ssl_getsock(connectdata *conn,curl_socket_t *socks)

{
  ssl_connect_state sVar1;
  int iVar2;
  
  sVar1 = conn->ssl[0].connecting_state;
  if (sVar1 == ssl_connect_2_writing) {
    iVar2 = 0x10000;
  }
  else {
    if (sVar1 != ssl_connect_2_reading) {
      return 0;
    }
    iVar2 = 1;
  }
  *socks = conn->sock[0];
  return iVar2;
}

Assistant:

int Curl_ssl_getsock(struct connectdata *conn, curl_socket_t *socks)
{
  struct ssl_connect_data *connssl = &conn->ssl[FIRSTSOCKET];

  if(connssl->connecting_state == ssl_connect_2_writing) {
    /* write mode */
    socks[0] = conn->sock[FIRSTSOCKET];
    return GETSOCK_WRITESOCK(0);
  }
  if(connssl->connecting_state == ssl_connect_2_reading) {
    /* read mode */
    socks[0] = conn->sock[FIRSTSOCKET];
    return GETSOCK_READSOCK(0);
  }

  return GETSOCK_BLANK;
}